

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

void __thiscall phosg::SubprocessResult::SubprocessResult(SubprocessResult *this)

{
  uint64_t uVar1;
  
  (this->stdout_contents)._M_dataplus._M_p = (pointer)&(this->stdout_contents).field_2;
  (this->stdout_contents)._M_string_length = 0;
  (this->stdout_contents).field_2._M_local_buf[0] = '\0';
  (this->stderr_contents)._M_dataplus._M_p = (pointer)&(this->stderr_contents).field_2;
  (this->stderr_contents)._M_string_length = 0;
  (this->stderr_contents).field_2._M_local_buf[0] = '\0';
  uVar1 = now();
  this->elapsed_time = uVar1;
  return;
}

Assistant:

SubprocessResult::SubprocessResult() : elapsed_time(now()) {}